

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TaggedUnionExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TaggedUnionExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax **args_2)

{
  Token member;
  Token tagged;
  TaggedUnionExpressionSyntax *expr;
  Info *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  expr = (TaggedUnionExpressionSyntax *)
         allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  tagged.info = in_RCX;
  tagged._0_8_ = in_RSI[1];
  member.info = (Info *)*in_RSI;
  member._0_8_ = in_RDX[1];
  slang::syntax::TaggedUnionExpressionSyntax::TaggedUnionExpressionSyntax
            ((TaggedUnionExpressionSyntax *)*in_RDX,tagged,member,(ExpressionSyntax *)expr);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }